

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_filter_row_paeth_1byte_pixel
               (png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  byte bVar1;
  png_size_t pVar2;
  uint uVar3;
  int iVar4;
  int local_50;
  int local_4c;
  int local_48;
  int p;
  int pc;
  int pb;
  int pa;
  int b;
  int c;
  int a;
  png_bytep rp_end;
  png_const_bytep prev_row_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  pVar2 = row_info->rowbytes;
  bVar1 = *prev_row;
  b = (uint)*row + (uint)bVar1;
  *row = (png_byte)b;
  pa = (uint)bVar1;
  rp_end = prev_row + 1;
  prev_row_local = row + 1;
  while (prev_row_local < row + pVar2) {
    uVar3 = (uint)*rp_end;
    local_50 = uVar3 - pa;
    iVar4 = (b & 0xffU) - pa;
    local_48 = local_50;
    if (local_50 < 0) {
      local_48 = -local_50;
    }
    pc = local_48;
    local_4c = iVar4;
    if (iVar4 < 0) {
      local_4c = -iVar4;
    }
    if (local_50 + iVar4 < 0) {
      local_50 = -(local_50 + iVar4);
    }
    else {
      local_50 = local_50 + iVar4;
    }
    b = b & 0xffU;
    if (local_4c < local_48) {
      pc = local_4c;
      b = uVar3;
    }
    if (local_50 < pc) {
      b = pa;
    }
    b = (uint)*prev_row_local + b;
    *prev_row_local = (png_byte)b;
    pa = uVar3;
    rp_end = rp_end + 1;
    prev_row_local = prev_row_local + 1;
  }
  return;
}

Assistant:

static void
png_read_filter_row_paeth_1byte_pixel(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   png_bytep rp_end = row + row_info->rowbytes;
   int a, c;

   /* First pixel/byte */
   c = *prev_row++;
   a = *row + c;
   *row++ = (png_byte)a;

   /* Remainder */
   while (row < rp_end)
   {
      int b, pa, pb, pc, p;

      a &= 0xff; /* From previous iteration or start */
      b = *prev_row++;

      p = b - c;
      pc = a - c;

#ifdef PNG_USE_ABS
      pa = abs(p);
      pb = abs(pc);
      pc = abs(p + pc);
#else
      pa = p < 0 ? -p : p;
      pb = pc < 0 ? -pc : pc;
      pc = (p + pc) < 0 ? -(p + pc) : p + pc;
#endif

      /* Find the best predictor, the least of pa, pb, pc favoring the earlier
       * ones in the case of a tie.
       */
      if (pb < pa)
      {
         pa = pb; a = b;
      }
      if (pc < pa) a = c;

      /* Calculate the current pixel in a, and move the previous row pixel to c
       * for the next time round the loop
       */
      c = b;
      a += *row;
      *row++ = (png_byte)a;
   }
}